

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_sock_closeall(void)

{
  nni_sock *s_00;
  nni_sock *s;
  
  while( true ) {
    nni_mtx_lock(&sock_lk);
    s_00 = (nni_sock *)nni_list_first(&sock_list);
    if (s_00 == (nni_sock *)0x0) break;
    s_00->s_ref = s_00->s_ref + 1;
    nni_list_node_remove((nni_list_node *)s_00);
    nni_mtx_unlock(&sock_lk);
    nni_sock_close(s_00);
  }
  nni_mtx_unlock(&sock_lk);
  return;
}

Assistant:

void
nni_sock_closeall(void)
{
	nni_sock *s;

	for (;;) {
		nni_mtx_lock(&sock_lk);
		if ((s = nni_list_first(&sock_list)) == NULL) {
			nni_mtx_unlock(&sock_lk);
			return;
		}
		// Bump the reference count.  The close call below
		// will drop it.
		s->s_ref++;
		nni_list_node_remove(&s->s_node);
		nni_mtx_unlock(&sock_lk);
		nni_sock_close(s);
	}
}